

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  void **ppvVar1;
  size_type *psVar2;
  PointerT<char> pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  pointer pcVar8;
  size_type sVar9;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 *puVar13;
  string *psVar14;
  pointer prVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar16;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar17;
  EnumDescriptor *pEVar18;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar20;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar21;
  Descriptor *pDVar22;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar23;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  anon_union_8_1_a8a14541_for_iterator_2 aVar24;
  DescriptorPool *pDVar25;
  Rep *pRVar26;
  ReservedRange *pRVar27;
  string *psVar28;
  undefined8 extraout_RAX;
  int iVar29;
  uint uVar30;
  uint uVar31;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar32;
  int index;
  iterator *b;
  FlatAllocator *pFVar33;
  ulong uVar34;
  RepeatedPtrFieldBase *pRVar35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  undefined8 uVar36;
  long lVar37;
  long lVar38;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  iterator iVar39;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  FieldDescriptor *field;
  ExtensionRange *range;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  iterator it;
  Symbol local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  *local_e8;
  int local_dc;
  undefined1 local_d8 [64];
  code *pcStack_98;
  undefined8 local_90;
  code *pcStack_88;
  undefined8 local_80;
  code *pcStack_78;
  size_type *local_70;
  code *pcStack_68;
  pointer local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  iterator local_40;
  
  if (parent == (Descriptor *)0x0) {
    psVar14 = this->file_->package_;
  }
  else {
    psVar14 = parent->all_names_ + 1;
  }
  puVar13 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = (psVar14->_M_dataplus)._M_p;
  scope._M_len = psVar14->_M_string_length;
  proto_name._M_str = (char *)*puVar13;
  proto_name._M_len = puVar13[1];
  local_130.ptr_ = &result->super_SymbolBase;
  psVar14 = AllocateNameStrings_abi_cxx11_(this,scope,proto_name,alloc);
  *(string **)(local_130.ptr_ + 8) = psVar14;
  puVar13 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pFVar33 = (FlatAllocator *)psVar14[1]._M_dataplus._M_p;
  name._M_str = (char *)*puVar13;
  name._M_len = puVar13[1];
  full_name_00._M_str = (char *)pFVar33;
  full_name_00._M_len = psVar14[1]._M_string_length;
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  *(FileDescriptor **)(local_130.ptr_ + 0x10) = this->file_;
  *(Descriptor **)(local_130.ptr_ + 0x18) = parent;
  local_130.ptr_[1].symbol_type_ = local_130.ptr_[1].symbol_type_ & 0xfe;
  local_130.ptr_[1].symbol_type_ = local_130.ptr_[1].symbol_type_ & 0xfd;
  local_130.ptr_[1].symbol_type_ = local_130.ptr_[1].symbol_type_ & 0x83;
  *(MessageOptions **)(local_130.ptr_ + 0x20) = (MessageOptions *)0x0;
  local_128._M_string_length = (size_type)this;
  local_40 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                         *)&((this->pool_->tables_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl)->well_known_types_,*(string **)(local_130.ptr_ + 8) + 1);
  b = (iterator *)local_d8;
  local_d8._0_8_ = (DescriptorPool *)0x0;
  bVar11 = absl::lts_20240722::container_internal::operator==(&local_40,b);
  if (!bVar11) {
    prVar15 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->(&local_40);
    local_130.ptr_[1].symbol_type_ =
         local_130.ptr_[1].symbol_type_ & 0x83 |
         ((char)prVar15->second & (WELLKNOWNTYPE_STRUCT|WELLKNOWNTYPE_LISTVALUE)) << 2;
  }
  *(uint16_t *)(local_130.ptr_ + 2) = 0;
  this_00 = &(proto->field_0)._impl_.field_;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    uVar30 = 0;
    do {
      b = (iterator *)(ulong)uVar30;
      pVVar16 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,uVar30);
      uVar31 = uVar30 + 1;
      if (((pVVar16->field_0)._impl_.number_ != uVar31) ||
         (*(uint16_t *)(local_130.ptr_ + 2) = (uint16_t)uVar31, 0xfffd < uVar30)) break;
      uVar30 = uVar31;
    } while ((int)uVar31 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar29 = *(int *)((long)&proto->field_0 + 0x88);
  *(int *)(local_130.ptr_ + 0x78) = iVar29;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_d8);
    iVar12 = extraout_EAX;
LAB_001ee7ea:
    psVar28 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar12,(long)b,"used <= total_.template Get<TypeToUse>()");
  }
  else {
    iVar12 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    this = (DescriptorBuilder *)(long)iVar12;
    iVar12 = iVar29 * 0x38 + iVar12;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar12;
    iVar29 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).total_.payload_.super_Base<char>.value;
    b = (iterator *)(long)iVar29;
    local_d8._32_8_ = this_00;
    if (iVar29 < iVar12) goto LAB_001ee7ea;
    psVar28 = (string *)0x0;
  }
  sVar9 = local_128._M_string_length;
  local_128.field_2._8_8_ = parent;
  if (psVar28 != (string *)0x0) {
    BuildMessage();
    goto LAB_001ee829;
  }
  *(OneofDescriptor **)(local_130.ptr_ + 0x40) =
       (OneofDescriptor *)((long)&this->pool_ + (long)pcVar3);
  if (0 < *(int *)((long)&proto->field_0 + 0x88)) {
    this = (DescriptorBuilder *)0x0;
    lVar37 = 0;
    do {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                           (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                            (int)lVar37);
      pFVar33 = alloc;
      BuildOneof((DescriptorBuilder *)sVar9,proto_00,(Descriptor *)local_130.ptr_,
                 (OneofDescriptor *)
                 ((long)&this->pool_ +
                 (long)&(*(OneofDescriptor **)(local_130.ptr_ + 0x40))->super_SymbolBase),alloc);
      lVar37 = lVar37 + 1;
      this = (DescriptorBuilder *)
             ((long)&(this->feature_resolver_).
                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                     _M_payload.
                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                     super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                     _M_value.defaults_ + 0x18);
    } while (lVar37 < *(int *)((long)&proto->field_0 + 0x88));
  }
  iVar29 = *(int *)((long)&proto->field_0 + 0x10);
  *(int *)(local_130.ptr_ + 4) = iVar29;
  pFVar17 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar29);
  uVar10 = local_d8._32_8_;
  *(FieldDescriptor **)(local_130.ptr_ + 0x38) = pFVar17;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    this = (DescriptorBuilder *)0x0;
    lVar37 = 0;
    do {
      pVVar16 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          ((RepeatedPtrFieldBase *)uVar10,(int)lVar37);
      pFVar33 = (FlatAllocator *)0x0;
      BuildFieldOrExtension
                ((DescriptorBuilder *)sVar9,pVVar16,(Descriptor *)local_130.ptr_,
                 (FieldDescriptor *)
                 ((long)&this->pool_ +
                 (long)&(*(FieldDescriptor **)(local_130.ptr_ + 0x38))->super_SymbolBase),false,
                 alloc);
      lVar37 = lVar37 + 1;
      this = (DescriptorBuilder *)
             ((long)&(this->feature_resolver_).
                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                     _M_payload.
                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                     super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                     _M_value.defaults_ + 0x38);
    } while (lVar37 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar29 = *(int *)((long)&proto->field_0 + 0x40);
  *(int *)(local_130.ptr_ + 0x84) = iVar29;
  pEVar18 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar29);
  *(EnumDescriptor **)(local_130.ptr_ + 0x50) = pEVar18;
  if (0 < *(int *)((long)&proto->field_0 + 0x40)) {
    this = (DescriptorBuilder *)0x0;
    lVar37 = 0;
    do {
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar37);
      pFVar33 = alloc;
      BuildEnum((DescriptorBuilder *)sVar9,proto_01,(Descriptor *)local_130.ptr_,
                (EnumDescriptor *)
                ((long)&this->pool_ +
                (long)&(*(EnumDescriptor **)(local_130.ptr_ + 0x50))->super_SymbolBase),alloc);
      lVar37 = lVar37 + 1;
      this = (DescriptorBuilder *)
             ((long)&(this->feature_resolver_).
                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                     _M_payload.
                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                     super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                     _M_value.defaults_ + 0x38);
    } while (lVar37 < *(int *)((long)&proto->field_0 + 0x40));
  }
  iVar29 = *(int *)((long)&proto->field_0 + 0x58);
  *(int *)(local_130.ptr_ + 0x88) = iVar29;
  pEVar19 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar29);
  *(ExtensionRange **)(local_130.ptr_ + 0x58) = pEVar19;
  if (0 < *(int *)((long)&proto->field_0 + 0x58)) {
    this = (DescriptorBuilder *)0x0;
    lVar37 = 0;
    do {
      pVVar20 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                          (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                           (int)lVar37);
      pFVar33 = alloc;
      BuildExtensionRange((DescriptorBuilder *)sVar9,pVVar20,(Descriptor *)local_130.ptr_,
                          (ExtensionRange *)
                          ((long)&this->pool_ +
                          (long)&(*(ExtensionRange **)(local_130.ptr_ + 0x58))->start_),alloc);
      lVar37 = lVar37 + 1;
      this = (DescriptorBuilder *)
             ((long)&(this->feature_resolver_).
                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                     _M_payload.
                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                     super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                     _M_value.defaults_ + 8);
    } while (lVar37 < *(int *)((long)&proto->field_0 + 0x58));
  }
  uVar30 = *(uint *)((long)&proto->field_0 + 0x70);
  pVVar16 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
             *)(ulong)uVar30;
  *(uint *)(local_130.ptr_ + 0x8c) = uVar30;
  pFVar17 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,uVar30);
  *(FieldDescriptor **)(local_130.ptr_ + 0x60) = pFVar17;
  if (0 < *(int *)((long)&proto->field_0 + 0x70)) {
    this = (DescriptorBuilder *)0x0;
    lVar37 = 0;
    do {
      pVVar16 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                           (int)lVar37);
      pFVar33 = (FlatAllocator *)0x1;
      BuildFieldOrExtension
                ((DescriptorBuilder *)sVar9,pVVar16,(Descriptor *)local_130.ptr_,
                 (FieldDescriptor *)
                 ((long)&this->pool_ +
                 (long)&(*(FieldDescriptor **)(local_130.ptr_ + 0x60))->super_SymbolBase),true,alloc
                );
      lVar37 = lVar37 + 1;
      this = (DescriptorBuilder *)
             ((long)&(this->feature_resolver_).
                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                     _M_payload.
                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                     super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                     _M_value.defaults_ + 0x38);
    } while (lVar37 < *(int *)((long)&proto->field_0 + 0x70));
  }
  iVar29 = *(int *)((long)&proto->field_0 + 0xa0);
  *(int *)(local_130.ptr_ + 0x90) = iVar29;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_d8);
    iVar12 = extraout_EAX_00;
LAB_001ee808:
    psVar28 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar12,(long)pVVar16,"used <= total_.template Get<TypeToUse>()");
  }
  else {
    iVar12 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    this = (DescriptorBuilder *)(long)iVar12;
    iVar12 = iVar12 + iVar29 * 8;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar12;
    iVar29 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).total_.payload_.super_Base<char>.value;
    pVVar16 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
               *)(long)iVar29;
    if (iVar29 < iVar12) goto LAB_001ee808;
    psVar28 = (string *)0x0;
  }
  sVar9 = local_128._M_string_length;
  if (psVar28 == (string *)0x0) {
    *(ReservedRange **)(local_130.ptr_ + 0x68) =
         (ReservedRange *)((long)&this->pool_ + (long)pcVar3);
    if (0 < *(int *)((long)&proto->field_0 + 0xa0)) {
      lVar37 = 0;
      lVar38 = 0;
      do {
        pVVar21 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                            (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                             (int)lVar38);
        BuildReservedRange((DescriptorBuilder *)sVar9,pVVar21,(Descriptor *)local_130.ptr_,
                           (ReservedRange *)
                           ((long)&(*(ReservedRange **)(local_130.ptr_ + 0x68))->start + lVar37),
                           pFVar33);
        lVar38 = lVar38 + 1;
        lVar37 = lVar37 + 8;
      } while (lVar38 < *(int *)((long)&proto->field_0 + 0xa0));
    }
    option_name._M_str = "google.protobuf.MessageOptions";
    option_name._M_len = 0x1e;
    AllocateOptions<google::protobuf::Descriptor>
              ((DescriptorBuilder *)sVar9,proto,(Descriptor *)local_130.ptr_,7,option_name,alloc);
    iVar29 = *(int *)(sVar9 + 0x168);
    *(int *)(sVar9 + 0x168) = iVar29 + -1;
    if (iVar29 < 2) {
      element_name._M_str = (*(string **)(local_130.ptr_ + 8))[1]._M_dataplus._M_p;
      element_name._M_len = (*(string **)(local_130.ptr_ + 8))[1]._M_string_length;
      AddError((DescriptorBuilder *)sVar9,element_name,&proto->super_Message,OTHER,
               "Reached maximum recursion limit for nested messages.");
      *(Descriptor **)(local_130.ptr_ + 0x48) = (Descriptor *)0x0;
      *(int *)(local_130.ptr_ + 0x80) = 0;
    }
    else {
      iVar29 = *(int *)((long)&proto->field_0 + 0x28);
      *(int *)(local_130.ptr_ + 0x80) = iVar29;
      pDVar22 = anon_unknown_23::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar29);
      uVar10 = local_128.field_2._8_8_;
      *(Descriptor **)(local_130.ptr_ + 0x48) = pDVar22;
      if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
        lVar37 = 0;
        lVar38 = 0;
        do {
          proto_02 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                               (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                (int)lVar38);
          BuildMessage((DescriptorBuilder *)local_128._M_string_length,proto_02,
                       (Descriptor *)local_130.ptr_,
                       (Descriptor *)
                       (&(*(Descriptor **)(local_130.ptr_ + 0x48))->super_SymbolBase + lVar37),alloc
                      );
          lVar38 = lVar38 + 1;
          lVar37 = lVar37 + 0x98;
        } while (lVar38 < *(int *)((long)&proto->field_0 + 0x28));
      }
      uVar30 = *(uint *)((long)&proto->field_0 + 0xb8);
      *(uint *)(local_130.ptr_ + 0x94) = uVar30;
      ppbVar23 = (anonymous_namespace)::
                 FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                 ::AllocateArray<std::__cxx11::string_const*>
                           ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                             *)alloc,uVar30);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
       (local_130.ptr_ + 0x70) = ppbVar23;
      local_128.field_2._M_allocated_capacity = (size_type)proto;
      if (0 < (int)uVar30) {
        uVar34 = 0;
        do {
          in = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,
                          (int)uVar34);
          psVar14 = (anonymous_namespace)::
                    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    ::AllocateStrings<std::__cxx11::string_const&>
                              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                *)alloc,in);
          (*(string ***)(local_130.ptr_ + 0x70))[uVar34] = psVar14;
          uVar34 = uVar34 + 1;
        } while (uVar30 != uVar34);
      }
      uVar36 = local_128.field_2._M_allocated_capacity;
      puVar13 = *(undefined8 **)(local_130.ptr_ + 8);
      pcVar4 = (char *)puVar13[4];
      sVar5 = puVar13[5];
      pcVar6 = (char *)*puVar13;
      sVar7 = puVar13[1];
      (local_130.ptr_)->symbol_type_ = '\x01';
      full_name._M_str = pcVar4;
      full_name._M_len = sVar5;
      name_00._M_str = pcVar6;
      name_00._M_len = sVar7;
      AddSymbol((DescriptorBuilder *)local_128._M_string_length,full_name,(void *)uVar10,name_00,
                (Message *)local_128.field_2._M_allocated_capacity,local_130);
      if (0 < *(int *)(uVar36 + 0xb0)) {
        pRVar35 = (RepeatedPtrFieldBase *)(uVar36 + 0xa8);
        uVar30 = 0;
        do {
          aVar24.slot_ = (slot_type *)
                         internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                   (pRVar35,uVar30);
          iVar29 = uVar30 + 1;
          local_e8 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                      *)CONCAT44(local_e8._4_4_,iVar29);
          local_128.field_2._8_8_ = (Descriptor *)(ulong)uVar30;
          if (iVar29 < *(int *)(local_128.field_2._M_allocated_capacity + 0xb0)) {
            do {
              pDVar25 = (DescriptorPool *)
                        internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                  (pRVar35,iVar29);
              if ((*(int *)&pDVar25->underlay_ < *(int *)((long)aVar24.slot_ + 0x1c)) &&
                 (*(int *)((long)aVar24.slot_ + 0x18) < *(int *)((long)&pDVar25->underlay_ + 4))) {
                pcVar4 = (*(string **)(local_130.ptr_ + 8))[1]._M_dataplus._M_p;
                sVar5 = (*(string **)(local_130.ptr_ + 8))[1]._M_string_length;
                pVVar21 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (pRVar35,(int)local_128.field_2._8_8_);
                pcStack_48 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                local_50.obj = local_d8;
                make_error.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                make_error.ptr_.obj = local_50.obj;
                element_name_00._M_str = pcVar4;
                element_name_00._M_len = sVar5;
                local_d8._0_8_ = pDVar25;
                local_d8._8_8_ = aVar24.slot_;
                AddError((DescriptorBuilder *)local_128._M_string_length,element_name_00,
                         &pVVar21->super_Message,NUMBER,make_error);
              }
              iVar29 = iVar29 + 1;
            } while (iVar29 < *(int *)(local_128.field_2._M_allocated_capacity + 0xb0));
          }
          uVar36 = local_128.field_2._M_allocated_capacity;
          uVar30 = (uint)local_e8;
        } while ((int)(uint)local_e8 < *(int *)(local_128.field_2._M_allocated_capacity + 0xb0));
      }
      local_d8._0_8_ = (DescriptorPool *)0x1;
      local_d8._8_8_ = (slot_type *)0x0;
      this_01 = &(((DescriptorProto *)uVar36)->field_0)._impl_.reserved_name_;
      pRVar32 = this_01;
      if ((*(byte *)((long)&((DescriptorProto *)uVar36)->field_0 + 0xb0) & 1) != 0) {
        pRVar26 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        pRVar32 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar26->elements;
      }
      if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar26 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar26->elements;
      }
      ppvVar1 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                *(int *)((long)&((DescriptorProto *)uVar36)->field_0 + 0xb8);
      if (pRVar32 !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppvVar1) {
        psVar2 = &local_108._M_string_length;
        do {
          key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pRVar32->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          local_128._M_dataplus._M_p = local_d8;
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)psVar2,&local_128,key_00,key_00);
          if (local_108.field_2._M_local_buf[8] == '\0') {
            pcStack_58 = absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.invoker_ =
                 absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = psVar2;
            element_name_01._M_str = (key_00->_M_dataplus)._M_p;
            element_name_01._M_len = key_00->_M_string_length;
            local_108._M_string_length = (size_type)key_00;
            local_60 = (pointer)psVar2;
            AddError((DescriptorBuilder *)local_128._M_string_length,element_name_01,
                     (Message *)local_128.field_2._M_allocated_capacity,NAME,make_error_00);
          }
          pRVar32 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&(pRVar32->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar32 !=
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ppvVar1);
      }
      if (0 < *(int *)(local_130.ptr_ + 4)) {
        local_e8 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                    *)(local_128._M_string_length + 0xe0);
        local_128.field_2._8_8_ = local_128.field_2._M_allocated_capacity + 0x60;
        pRVar35 = (RepeatedPtrFieldBase *)(local_128.field_2._M_allocated_capacity + 0xa8);
        iVar29 = 0;
        psVar2 = &local_108._M_string_length;
        do {
          local_128._M_dataplus._M_p =
               (pointer)Descriptor::field((Descriptor *)local_130.ptr_,iVar29);
          local_dc = iVar29;
          if (0 < *(int *)(local_130.ptr_ + 0x88)) {
            iVar29 = 0;
            do {
              local_108._M_dataplus._M_p =
                   (pointer)Descriptor::extension_range((Descriptor *)local_130.ptr_,iVar29);
              if ((((ExtensionRange *)local_108._M_dataplus._M_p)->start_ <=
                   *(int *)(local_128._M_dataplus._M_p + 4)) &&
                 (*(int *)(local_128._M_dataplus._M_p + 4) <
                  ((ExtensionRange *)local_108._M_dataplus._M_p)->end_)) {
                absl::lts_20240722::container_internal::
                raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::try_emplace_impl<google::protobuf::Descriptor*const&>
                          ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                            *)psVar2,local_e8,(Descriptor **)&local_130);
                uVar10 = local_108.field_2._M_allocated_capacity;
                pVVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_128.field_2._8_8_,iVar29);
                iVar12 = *(int *)(uVar10 + 8);
                if (iVar12 < 0) {
                  iVar12 = -1;
                }
                uVar30 = iVar12 + 1;
                if (0x1ffffffe < uVar30) {
                  uVar30 = 0x1fffffff;
                }
                *(uint *)(uVar10 + 8) = uVar30;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar10 + 0x10))->_M_allocated_capacity == 0) {
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar10 + 0x10))->_M_allocated_capacity = (size_type)pVVar20;
                  *(undefined4 *)(uVar10 + 0x18) = 1;
                }
                pcVar8 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_dataplus._M_p;
                sVar9 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_string_length;
                pVVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_128.field_2._8_8_,iVar29);
                local_108._M_string_length = (size_type)&local_108;
                local_108.field_2._M_allocated_capacity = (size_type)&local_128;
                pcStack_68 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.ptr_.obj = psVar2;
                element_name_02._M_str = pcVar8;
                element_name_02._M_len = sVar9;
                local_70 = psVar2;
                AddError((DescriptorBuilder *)local_128._M_string_length,element_name_02,
                         &pVVar20->super_Message,NUMBER,make_error_01);
              }
              iVar29 = iVar29 + 1;
            } while (iVar29 < *(int *)(local_130.ptr_ + 0x88));
          }
          if (0 < *(int *)(local_130.ptr_ + 0x90)) {
            iVar29 = 0;
            do {
              pRVar27 = Descriptor::reserved_range((Descriptor *)local_130.ptr_,iVar29);
              if ((pRVar27->start <= *(int *)(local_128._M_dataplus._M_p + 4)) &&
                 (*(int *)(local_128._M_dataplus._M_p + 4) < pRVar27->end)) {
                absl::lts_20240722::container_internal::
                raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::try_emplace_impl<google::protobuf::Descriptor*const&>
                          ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                            *)psVar2,local_e8,(Descriptor **)&local_130);
                uVar10 = local_108.field_2._M_allocated_capacity;
                pVVar21 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (pRVar35,iVar29);
                iVar12 = *(int *)(uVar10 + 8);
                if (iVar12 < 0) {
                  iVar12 = -1;
                }
                uVar30 = iVar12 + 1;
                if (0x1ffffffe < uVar30) {
                  uVar30 = 0x1fffffff;
                }
                *(uint *)(uVar10 + 8) = uVar30;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar10 + 0x10))->_M_allocated_capacity == 0) {
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar10 + 0x10))->_M_allocated_capacity = (size_type)pVVar21;
                  *(undefined4 *)(uVar10 + 0x18) = 1;
                }
                pcVar8 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_dataplus._M_p;
                sVar9 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_string_length;
                pVVar21 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (pRVar35,iVar29);
                local_108._M_string_length = (size_type)&local_128;
                pcStack_78 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                ;
                make_error_02.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                ;
                make_error_02.ptr_.obj = psVar2;
                element_name_03._M_str = pcVar8;
                element_name_03._M_len = sVar9;
                local_80 = psVar2;
                AddError((DescriptorBuilder *)local_128._M_string_length,element_name_03,
                         &pVVar21->super_Message,NUMBER,make_error_02);
              }
              iVar29 = iVar29 + 1;
            } while (iVar29 < *(int *)(local_130.ptr_ + 0x90));
          }
          iVar39 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::find<std::__cxx11::string>
                             ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                               *)local_d8,
                              *(key_arg<std::__cxx11::basic_string<char>_> **)
                               (local_128._M_dataplus._M_p + 8));
          iVar29 = local_dc;
          if (iVar39.ctrl_ != (ctrl_t *)0x0) {
            pcVar8 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_dataplus._M_p;
            sVar9 = (*(string **)(local_128._M_dataplus._M_p + 8))[1]._M_string_length;
            pVVar16 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_d8._32_8_,local_dc);
            local_108._M_string_length = (size_type)&local_128;
            pcStack_88 = absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
            ;
            make_error_03.invoker_ =
                 absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
            ;
            make_error_03.ptr_.obj = psVar2;
            element_name_04._M_str = pcVar8;
            element_name_04._M_len = sVar9;
            local_90 = psVar2;
            AddError((DescriptorBuilder *)local_128._M_string_length,element_name_04,
                     &pVVar16->super_Message,NAME,make_error_03);
          }
          iVar29 = iVar29 + 1;
        } while (iVar29 < *(int *)(local_130.ptr_ + 4));
      }
      if (0 < *(int *)(local_130.ptr_ + 0x88)) {
        pRVar35 = (RepeatedPtrFieldBase *)(local_128.field_2._M_allocated_capacity + 0x60);
        iVar29 = 0;
        do {
          local_128._M_dataplus._M_p =
               (pointer)Descriptor::extension_range((Descriptor *)local_130.ptr_,iVar29);
          if (0 < *(int *)(local_130.ptr_ + 0x90)) {
            iVar12 = 0;
            do {
              local_108._M_dataplus._M_p =
                   (pointer)Descriptor::reserved_range((Descriptor *)local_130.ptr_,iVar12);
              if ((((ExtensionRange *)local_108._M_dataplus._M_p)->start_ <
                   *(int *)(local_128._M_dataplus._M_p + 4)) &&
                 (*(int *)local_128._M_dataplus._M_p <
                  ((ExtensionRange *)local_108._M_dataplus._M_p)->end_)) {
                pcVar4 = (*(string **)(local_130.ptr_ + 8))[1]._M_dataplus._M_p;
                sVar5 = (*(string **)(local_130.ptr_ + 8))[1]._M_string_length;
                pVVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (pRVar35,iVar29);
                local_108._M_string_length = (size_type)&local_128;
                local_108.field_2._M_allocated_capacity = (size_type)&local_108;
                pcStack_98 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                ;
                local_d8._56_8_ = &local_108._M_string_length;
                make_error_04.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                ;
                make_error_04.ptr_.obj = (void *)local_d8._56_8_;
                element_name_05._M_str = pcVar4;
                element_name_05._M_len = sVar5;
                AddError((DescriptorBuilder *)local_128._M_string_length,element_name_05,
                         &pVVar20->super_Message,NUMBER,make_error_04);
              }
              iVar12 = iVar12 + 1;
            } while (iVar12 < *(int *)(local_130.ptr_ + 0x90));
          }
          iVar12 = iVar29 + 1;
          index = iVar12;
          if (iVar12 < *(int *)(local_130.ptr_ + 0x88)) {
            do {
              local_108._M_dataplus._M_p =
                   (pointer)Descriptor::extension_range((Descriptor *)local_130.ptr_,index);
              if ((((ExtensionRange *)local_108._M_dataplus._M_p)->start_ <
                   *(int *)(local_128._M_dataplus._M_p + 4)) &&
                 (*(int *)local_128._M_dataplus._M_p <
                  ((ExtensionRange *)local_108._M_dataplus._M_p)->end_)) {
                pcVar4 = (*(string **)(local_130.ptr_ + 8))[1]._M_dataplus._M_p;
                sVar5 = (*(string **)(local_130.ptr_ + 8))[1]._M_string_length;
                pVVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    (pRVar35,iVar29);
                local_108._M_string_length = (size_type)&local_108;
                local_108.field_2._M_allocated_capacity = (size_type)&local_128;
                local_d8._48_8_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                ;
                local_d8._40_8_ = &local_108._M_string_length;
                make_error_05.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                ;
                make_error_05.ptr_.obj = (void *)local_d8._40_8_;
                element_name_06._M_str = pcVar4;
                element_name_06._M_len = sVar5;
                AddError((DescriptorBuilder *)local_128._M_string_length,element_name_06,
                         &pVVar20->super_Message,NUMBER,make_error_05);
              }
              index = index + 1;
            } while (index < *(int *)(local_130.ptr_ + 0x88));
          }
          iVar29 = iVar12;
        } while (iVar12 < *(int *)(local_130.ptr_ + 0x88));
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_d8);
    }
    *(int *)(local_128._M_string_length + 0x168) = *(int *)(local_128._M_string_length + 0x168) + 1;
    return;
  }
LAB_001ee829:
  BuildMessage();
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_d8);
  *(int *)(local_128._M_string_length + 0x168) = *(int *)(local_128._M_string_length + 0x168) + 1;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}